

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isBilinearRangeValid
               (LookupPrecision *prec,ColorQuad *quad,Vec2 *xBounds,Vec2 *yBounds,float searchStep,
               Vec4 *result)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  float fVar9;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<bool,_4> res_11;
  Vector<bool,_4> res_9;
  Vec4 maxVal;
  Vec4 minVal;
  Vector<float,_4> res_6;
  undefined1 local_d8 [16];
  Vec4 local_c8;
  float local_b4;
  byte local_b0 [8];
  float local_a8 [8];
  ulong local_88 [3];
  Vec2 *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_d8._0_4_ = 0.0;
  local_d8._4_4_ = 0.0;
  local_d8._8_4_ = 0.0;
  local_d8._12_4_ = 0.0;
  lVar4 = 0;
  do {
    fVar9 = (quad->p01).m_data[lVar4];
    fVar1 = (quad->p11).m_data[lVar4];
    uVar8 = -(uint)(fVar9 <= fVar1);
    *(uint *)(local_d8 + lVar4 * 4) = ~uVar8 & (uint)fVar1 | (uint)fVar9 & uVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar9 = (quad->p10).m_data[lVar4];
    uVar8 = -(uint)(fVar9 <= *(float *)(local_d8 + lVar4 * 4));
    local_c8.m_data[lVar4] =
         (float)(~uVar8 & (uint)*(float *)(local_d8 + lVar4 * 4) | (uint)fVar9 & uVar8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  lVar4 = 0;
  do {
    fVar9 = (quad->p00).m_data[lVar4];
    uVar8 = -(uint)(fVar9 <= local_c8.m_data[lVar4]);
    local_a8[lVar4] = (float)(~uVar8 & (uint)local_c8.m_data[lVar4] | (uint)fVar9 & uVar8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_a8[4] = 0.0;
  local_a8[5] = 0.0;
  local_a8[6] = 0.0;
  local_a8[7] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4 + 4] = local_a8[lVar4] - (prec->colorThreshold).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_d8 = ZEXT816(0);
  lVar4 = 0;
  do {
    fVar9 = (quad->p01).m_data[lVar4];
    fVar1 = (quad->p11).m_data[lVar4];
    uVar8 = -(uint)(fVar1 <= fVar9);
    *(uint *)(local_d8 + lVar4 * 4) = ~uVar8 & (uint)fVar1 | (uint)fVar9 & uVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar9 = (quad->p10).m_data[lVar4];
    uVar8 = -(uint)(*(float *)(local_d8 + lVar4 * 4) <= fVar9);
    local_c8.m_data[lVar4] =
         (float)(~uVar8 & (uint)*(float *)(local_d8 + lVar4 * 4) | (uint)fVar9 & uVar8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_88[0] = 0;
  local_88[1] = 0;
  lVar4 = 0;
  do {
    fVar9 = (quad->p00).m_data[lVar4];
    uVar8 = -(uint)(local_c8.m_data[lVar4] <= fVar9);
    *(uint *)((long)local_88 + lVar4 * 4) =
         ~uVar8 & (uint)local_c8.m_data[lVar4] | (uint)fVar9 & uVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4] = *(float *)((long)local_88 + lVar4 * 4) + (prec->colorThreshold).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_88[0] = local_88[0] & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(bool *)((long)local_88 + lVar4) = local_a8[lVar4 + 4] <= result->m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_b0[4] = 0;
  local_b0[5] = 0;
  local_b0[6] = 0;
  local_b0[7] = 0;
  lVar4 = 0;
  do {
    local_b0[lVar4 + 4] = result->m_data[lVar4] <= local_a8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  auVar2._12_4_ = 0;
  auVar2._0_12_ = local_d8._4_12_;
  local_d8 = auVar2 << 0x20;
  lVar4 = 0;
  do {
    local_d8[lVar4] = local_b0[lVar4 + 4] & *(byte *)((long)local_88 + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_b0[0] = 0;
  local_b0[1] = 0;
  local_b0[2] = 0;
  local_b0[3] = 0;
  lVar4 = 0;
  do {
    local_b0[lVar4] = (prec->colorMask).m_data[lVar4] ^ 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_c8.m_data._0_8_ = local_c8.m_data._0_8_ & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(byte *)((long)local_c8.m_data + lVar4) = local_b0[lVar4] | local_d8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (local_c8.m_data[0]._0_1_ != '\0') {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 2) {
        uVar6 = 3;
        break;
      }
      uVar6 = uVar5 + 1;
      lVar4 = uVar5 + 2;
      uVar5 = uVar6;
    } while (*(char *)((long)local_c8.m_data + lVar4) != '\0');
    if (2 < uVar6) {
      local_48 = xBounds->m_data[0];
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      local_58 = ZEXT416((uint)xBounds->m_data[1]);
      fVar9 = xBounds->m_data[1] + searchStep;
      local_68 = ZEXT416((uint)fVar9);
      bVar7 = local_48 < fVar9;
      if (fVar9 <= local_48) {
        return bVar7;
      }
      local_b4 = searchStep;
      local_70 = yBounds;
      while( true ) {
        fVar9 = (float)(~-(uint)(local_48 <= (float)local_58._0_4_) & local_58._0_4_ |
                       -(uint)(local_48 <= (float)local_58._0_4_) & (uint)local_48);
        local_d8 = ZEXT816(0);
        lVar4 = 0;
        do {
          *(float *)(local_d8 + lVar4 * 4) = (quad->p00).m_data[lVar4] * (1.0 - fVar9);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_a8[4] = 0.0;
        local_a8[5] = 0.0;
        local_a8[6] = 0.0;
        local_a8[7] = 0.0;
        lVar4 = 0;
        do {
          local_a8[lVar4 + 4] = (quad->p10).m_data[lVar4] * fVar9;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_c8.m_data[0] = 0.0;
        local_c8.m_data[1] = 0.0;
        local_c8.m_data[2] = 0.0;
        local_c8.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_c8.m_data[lVar4] = *(float *)(local_d8 + lVar4 * 4) + local_a8[lVar4 + 4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_a8[4] = 0.0;
        local_a8[5] = 0.0;
        local_a8[6] = 0.0;
        local_a8[7] = 0.0;
        lVar4 = 0;
        do {
          local_a8[lVar4 + 4] = (quad->p01).m_data[lVar4] * (1.0 - fVar9);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_a8[0] = 0.0;
        local_a8[1] = 0.0;
        local_a8[2] = 0.0;
        local_a8[3] = 0.0;
        lVar4 = 0;
        do {
          local_a8[lVar4] = (quad->p11).m_data[lVar4] * fVar9;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_d8 = ZEXT816(0);
        lVar4 = 0;
        do {
          *(float *)(local_d8 + lVar4 * 4) = local_a8[lVar4 + 4] + local_a8[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        bVar3 = isLinearRangeValid(prec,&local_c8,(Vec4 *)local_d8,local_70,result);
        if (bVar3) break;
        local_48 = local_48 + local_b4;
        bVar7 = local_48 < (float)local_68._0_4_;
        if ((float)local_68._0_4_ <= local_48) {
          return bVar7;
        }
      }
      return bVar7;
    }
  }
  return false;
}

Assistant:

static bool isBilinearRangeValid (const LookupPrecision&	prec,
								  const ColorQuad&			quad,
								  const Vec2&				xBounds,
								  const Vec2&				yBounds,
								  const float				searchStep,
								  const Vec4&				result)
{
	DE_ASSERT(xBounds.x() <= xBounds.y());
	DE_ASSERT(yBounds.x() <= yBounds.y());
	DE_ASSERT(xBounds.x() + searchStep > xBounds.x()); // step is not effectively 0
	DE_ASSERT(xBounds.y() + searchStep > xBounds.y());

	if (!isInColorBounds(prec, quad, result))
		return false;

	for (float x = xBounds.x(); x < xBounds.y()+searchStep; x += searchStep)
	{
		const float		a	= de::min(x, xBounds.y());
		const Vec4		c0	= quad.p00*(1.0f - a) + quad.p10*a;
		const Vec4		c1	= quad.p01*(1.0f - a) + quad.p11*a;

		if (isLinearRangeValid(prec, c0, c1, yBounds, result))
			return true;
	}

	return false;
}